

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O2

void __thiscall xmrig::Client::startTimeout(Client *this)

{
  bool bVar1;
  long lVar2;
  uint64_t uVar3;
  long lVar4;
  
  this->m_expire = 0;
  bVar1 = has<(xmrig::IClient::Extension)2>(this);
  if (bVar1) {
    lVar2 = (long)(this->super_BaseClient).m_pool.m_keepAlive;
    lVar4 = 60000;
    if (0 < lVar2) {
      lVar4 = lVar2 * 1000;
    }
    uVar3 = Chrono::steadyMSecs();
    this->m_keepAlive = uVar3 + lVar4;
  }
  return;
}

Assistant:

void xmrig::Client::startTimeout()
{
    m_expire = 0;

    if (has<EXT_KEEPALIVE>()) {
        const uint64_t ms = static_cast<uint64_t>(m_pool.keepAlive() > 0 ? m_pool.keepAlive() : Pool::kKeepAliveTimeout) * 1000;

        m_keepAlive = Chrono::steadyMSecs() + ms;
    }
}